

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,Type type,string *m_key_name,string *description,
          vector<RPCResult,_std::allocator<RPCResult>_> *inner,bool skip_type_check)

{
  byte optional;
  uint uVar1;
  undefined8 in_RCX;
  RPCResult *in_RDX;
  undefined4 in_ESI;
  string *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 skip_type_check_00;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  Type type_00;
  undefined1 local_60 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  type_00 = (Type)((ulong)in_RCX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  optional = in_R9B & 1;
  this_00 = &local_28;
  std::__cxx11::string::string
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_ESI,in_stack_ffffffffffffff40));
  std::__cxx11::string::string
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_ESI,in_stack_ffffffffffffff40));
  skip_type_check_00 = (undefined1)((ulong)local_60 >> 0x38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)0x3cc934);
  uVar1 = optional & 1;
  RPCResult(in_RDX,type_00,in_R8,(bool)optional,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
            (bool)skip_type_check_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffff18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,uVar1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        Type type,
        std::string m_key_name,
        std::string description,
        std::vector<RPCResult> inner = {},
        bool skip_type_check = false)
        : RPCResult{type, std::move(m_key_name), /*optional=*/false, std::move(description), std::move(inner), skip_type_check} {}